

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcess.cpp
# Opt level: O0

void __thiscall MultiAgentDecisionProcess::AddAgent(MultiAgentDecisionProcess *this,string *name)

{
  size_type sVar1;
  Index i;
  Agent *in_RSI;
  string *in_RDI;
  Index agI;
  undefined4 in_stack_ffffffffffffff28;
  Index in_stack_ffffffffffffff2c;
  string *name_00;
  Agent *this_00;
  allocator<char> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  
  sVar1 = in_RDI[2].field_2._M_allocated_capacity;
  in_RDI[2].field_2._M_allocated_capacity = sVar1 + 1;
  i = (Index)sVar1;
  name_00 = (string *)((long)&in_RDI[2].field_2 + 8);
  this_00 = (Agent *)&stack0xffffffffffffff6f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  Agent::Agent(this_00,i,name_00,in_RDI);
  std::vector<Agent,_std::allocator<Agent>_>::push_back
            ((vector<Agent,_std::allocator<Agent>_> *)in_RSI,
             (value_type *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  Agent::~Agent(in_RSI);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
  Scope::Insert((Scope *)in_RSI,in_stack_ffffffffffffff2c);
  return;
}

Assistant:

void MultiAgentDecisionProcess::AddAgent(string name)
{
    Index agI = _m_nrAgents++;
    _m_agents.push_back( Agent(agI, name) );
    _m_allAgentsScope.Insert(agI);
}